

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afglobal.c
# Opt level: O1

FT_Error af_face_globals_new(FT_Face face,AF_FaceGlobals *aglobals,AF_Module module)

{
  AF_Script_UniRange pAVar1;
  byte *pbVar2;
  FT_Face face_00;
  FT_UShort *gstyles;
  FT_Error FVar3;
  FT_UInt32 FVar4;
  FT_UInt FVar5;
  AF_FaceGlobals globals;
  hb_font_t *phVar6;
  hb_buffer_t *phVar7;
  ulong uVar8;
  FT_ULong FVar9;
  ulong uVar10;
  long lVar11;
  FT_UShort FVar12;
  long lVar13;
  AF_StyleClassRec *pAVar14;
  AF_Script_UniRange pAVar15;
  FT_CharMap charmap;
  FT_UInt gindex;
  FT_Error error;
  uint local_58;
  FT_UInt local_54;
  FT_UInt local_50;
  FT_Error local_4c;
  FT_CharMap local_48;
  AF_FaceGlobals *local_40;
  AF_ScriptClass local_38;
  
  globals = (AF_FaceGlobals)ft_mem_alloc(face->memory,face->num_glyphs * 2 + 0x308,&local_4c);
  if (local_4c == 0) {
    globals->face = face;
    globals->glyph_count = face->num_glyphs;
    globals->glyph_styles = (FT_UShort *)(globals + 1);
    globals->module = module;
    globals->stem_darkening_for_ppem = 0;
    globals->standard_vertical_width = 0;
    globals->standard_horizontal_width = 0;
    globals->darken_x = 0;
    globals->darken_y = 0;
    globals->scale_down_factor = 0;
    phVar6 = (hb_font_t *)hb_ft_font_create(face,0);
    globals->hb_font = phVar6;
    phVar7 = (hb_buffer_t *)hb_buffer_create();
    globals->hb_buf = phVar7;
    face_00 = globals->face;
    charmap = face_00->charmap;
    gstyles = globals->glyph_styles;
    uVar8 = (ulong)(uint)globals->glyph_count;
    if (uVar8 != 0) {
      uVar10 = 0;
      do {
        gstyles[uVar10] = 0x3fff;
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    FVar3 = FT_Select_Charmap(face_00,FT_ENCODING_UNICODE);
    if (FVar3 == 0) {
      local_58 = 0xffffffff;
      pAVar14 = &af_adlm_dflt_style_class;
      lVar13 = 0;
      local_48 = charmap;
      local_40 = aglobals;
      do {
        pAVar15 = af_script_classes[pAVar14->script]->script_uni_ranges;
        if (pAVar15 != (AF_Script_UniRange)0x0) {
          if (pAVar14->coverage == AF_COVERAGE_DEFAULT) {
            if (pAVar14->script == globals->module->default_script) {
              local_58 = (uint)lVar13;
            }
            FVar4 = pAVar15->first;
            local_38 = af_script_classes[pAVar14->script];
            while (FVar12 = (FT_UShort)lVar13, FVar4 != 0) {
              FVar9 = (FT_ULong)FVar4;
              local_50 = FT_Get_Char_Index(face_00,FVar9);
              if (((local_50 != 0) && (uVar8 = (ulong)local_50, uVar8 < (ulong)globals->glyph_count)
                  ) && ((~gstyles[uVar8] & 0x3fff) == 0)) {
                gstyles[uVar8] = FVar12;
              }
              while ((FVar9 = FT_Get_Next_Char(face_00,FVar9,&local_50), local_50 != 0 &&
                     (FVar9 <= pAVar15->last))) {
                uVar8 = (ulong)local_50;
                if ((uVar8 < (ulong)globals->glyph_count) && ((~gstyles[uVar8] & 0x3fff) == 0)) {
                  gstyles[uVar8] = FVar12;
                }
              }
              pAVar1 = pAVar15 + 1;
              pAVar15 = pAVar15 + 1;
              FVar4 = pAVar1->first;
            }
            pAVar15 = local_38->script_uni_nonbase_ranges;
            FVar4 = pAVar15->first;
            while (FVar4 != 0) {
              FVar9 = (FT_ULong)FVar4;
              local_54 = FT_Get_Char_Index(face_00,FVar9);
              if (((local_54 != 0) && (uVar8 = (ulong)local_54, uVar8 < (ulong)globals->glyph_count)
                  ) && ((gstyles[uVar8] & 0x3fff) == FVar12)) {
                gstyles[uVar8] = gstyles[uVar8] | 0x4000;
              }
              while ((FVar9 = FT_Get_Next_Char(face_00,FVar9,&local_54), local_54 != 0 &&
                     (FVar9 <= pAVar15->last))) {
                uVar8 = (ulong)local_54;
                if ((uVar8 < (ulong)globals->glyph_count) && ((gstyles[uVar8] & 0x3fff) == FVar12))
                {
                  gstyles[uVar8] = gstyles[uVar8] | 0x4000;
                }
              }
              pAVar1 = pAVar15 + 1;
              pAVar15 = pAVar15 + 1;
              FVar4 = pAVar1->first;
            }
          }
          else {
            af_shaper_get_coverage(globals,pAVar14,gstyles,'\0');
          }
        }
        aglobals = local_40;
        charmap = local_48;
        pAVar14 = af_style_classes[lVar13 + 1];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x54);
      pAVar14 = &af_adlm_dflt_style_class;
      lVar13 = 1;
      do {
        if (pAVar14->coverage == AF_COVERAGE_DEFAULT) {
          af_shaper_get_coverage(globals,pAVar14,gstyles,'\0');
        }
        pAVar14 = af_style_classes[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x55);
      af_shaper_get_coverage(globals,af_style_classes[local_58],gstyles,'\x01');
      FVar9 = 0x30;
      do {
        FVar5 = FT_Get_Char_Index(face_00,FVar9);
        if ((FVar5 != 0) && ((ulong)FVar5 < (ulong)globals->glyph_count)) {
          pbVar2 = (byte *)((long)gstyles + (ulong)FVar5 * 2 + 1);
          *pbVar2 = *pbVar2 | 0x80;
        }
        FVar9 = FVar9 + 1;
      } while (FVar9 != 0x3a);
    }
    FVar5 = globals->module->fallback_style;
    if ((FVar5 != 0x3fff) && (lVar13 = globals->glyph_count, 0 < lVar13)) {
      lVar11 = 0;
      do {
        if ((~gstyles[lVar11] & 0x3fff) == 0) {
          gstyles[lVar11] = gstyles[lVar11] & 0xc000 | (ushort)FVar5;
        }
        lVar11 = lVar11 + 1;
      } while (lVar13 != lVar11);
    }
    FT_Set_Charmap(face_00,charmap);
    local_4c = 0;
    globals->increase_x_height = 0;
  }
  *aglobals = globals;
  return local_4c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_face_globals_new( FT_Face          face,
                       AF_FaceGlobals  *aglobals,
                       AF_Module        module )
  {
    FT_Error        error;
    FT_Memory       memory;
    AF_FaceGlobals  globals = NULL;


    memory = face->memory;

    /* we allocate an AF_FaceGlobals structure together */
    /* with the glyph_styles array                      */
    if ( FT_ALLOC( globals,
                   sizeof ( *globals ) +
                     (FT_ULong)face->num_glyphs * sizeof ( FT_UShort ) ) )
      goto Exit;

    globals->face                      = face;
    globals->glyph_count               = face->num_glyphs;
    /* right after the globals structure come the glyph styles */
    globals->glyph_styles              = (FT_UShort*)( globals + 1 );
    globals->module                    = module;
    globals->stem_darkening_for_ppem   = 0;
    globals->darken_x                  = 0;
    globals->darken_y                  = 0;
    globals->standard_vertical_width   = 0;
    globals->standard_horizontal_width = 0;
    globals->scale_down_factor         = 0;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
    globals->hb_font = hb_ft_font_create( face, NULL );
    globals->hb_buf  = hb_buffer_create();
#endif

    error = af_face_globals_compute_style_coverage( globals );
    if ( error )
    {
      af_face_globals_free( globals );
      globals = NULL;
    }
    else
      globals->increase_x_height = AF_PROP_INCREASE_X_HEIGHT_MAX;

  Exit:
    *aglobals = globals;
    return error;
  }